

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O0

int32_t aeron::concurrent::logbuffer::ExclusiveTermAppender::handleEndOfLogCondition
                  (AtomicBuffer *termBuffer,int32_t termId,int32_t termOffset,HeaderWriter *header,
                  index_t termLength)

{
  int32_t paddingLength;
  index_t termLength_local;
  HeaderWriter *header_local;
  int32_t termOffset_local;
  int32_t termId_local;
  AtomicBuffer *termBuffer_local;
  
  if (termOffset < termLength) {
    HeaderWriter::write(header,(int)termBuffer,(void *)(ulong)(uint)termOffset,
                        (ulong)(uint)(termLength - termOffset));
    FrameDescriptor::frameType(termBuffer,termOffset,0);
    FrameDescriptor::frameLengthOrdered(termBuffer,termOffset,termLength - termOffset);
  }
  return -2;
}

Assistant:

inline static std::int32_t handleEndOfLogCondition(
        AtomicBuffer& termBuffer,
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        util::index_t termLength)
    {
        if (termOffset < termLength)
        {
            const std::int32_t paddingLength = termLength - termOffset;
            header.write(termBuffer, termOffset, paddingLength, termId);
            FrameDescriptor::frameType(termBuffer, termOffset, DataFrameHeader::HDR_TYPE_PAD);
            FrameDescriptor::frameLengthOrdered(termBuffer, termOffset, paddingLength);
        }

        return TERM_APPENDER_FAILED;
    }